

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

bv_uint64 bsim::get_shift_int(quad_value_bit_vector *shift_amount)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  quad_value_bit_vector *in_RDI;
  quad_value_bit_vector *unaff_retaddr;
  bv_uint64 shift_int;
  ulong local_10;
  
  iVar3 = quad_value_bit_vector::bitLength(in_RDI);
  if (0x40 < iVar3) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x3b0,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
  }
  iVar3 = quad_value_bit_vector::bitLength(in_RDI);
  if (iVar3 < 0x21) {
    iVar3 = quad_value_bit_vector::bitLength(in_RDI);
    if (iVar3 < 0x11) {
      iVar3 = quad_value_bit_vector::bitLength(in_RDI);
      if (iVar3 < 9) {
        bVar1 = quad_value_bit_vector::to_type<unsigned_char>(unaff_retaddr);
        local_10 = (ulong)bVar1;
      }
      else {
        uVar2 = quad_value_bit_vector::to_type<unsigned_short>(unaff_retaddr);
        local_10 = (ulong)uVar2;
      }
    }
    else {
      uVar4 = quad_value_bit_vector::to_type<unsigned_int>(unaff_retaddr);
      local_10 = (ulong)uVar4;
    }
  }
  else {
    local_10 = quad_value_bit_vector::to_type<unsigned_long>(shift_amount);
  }
  if (0x40 < local_10) {
    __assert_fail("shift_int < 65",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x3c2,"bv_uint64 bsim::get_shift_int(const quad_value_bit_vector &)");
  }
  return local_10;
}

Assistant:

static inline
  bv_uint64 get_shift_int(const quad_value_bit_vector& shift_amount) {
    bv_uint64 shift_int = 0;
    if (shift_amount.bitLength() > 64) {
      assert(false);
    }

    else if (shift_amount.bitLength() > 32) {
      shift_int = shift_amount.to_type<bv_uint64>();
    }

    else if (shift_amount.bitLength() > 16) {
      shift_int = (bv_uint64) (shift_amount.to_type<bv_uint32>());
    }

    else if (shift_amount.bitLength() > 8) {
      shift_int = (bv_uint64) (shift_amount.to_type<bv_uint16>());
    } else {
      shift_int = (bv_uint64) (shift_amount.to_type<bv_uint8>());
    }

    //std::cout << "shift_int = " << shift_int << std::endl;
    assert(shift_int < 65);

    return shift_int;
  }